

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::IFilePartLoader::~IFilePartLoader(IFilePartLoader *this)

{
  (this->super_ExtraDataLoader)._vptr_ExtraDataLoader = (_func_int **)&PTR__IFilePartLoader_00954318
  ;
  deleteFilePartLoader(this);
  if (this->mParserImpl != (IParserImpl *)0x0) {
    (*this->mParserImpl->_vptr_IParserImpl[1])();
    this->mParserImpl = (IParserImpl *)0x0;
  }
  ExtraDataLoader::~ExtraDataLoader(&this->super_ExtraDataLoader);
  return;
}

Assistant:

IFilePartLoader::~IFilePartLoader()
	{
		deleteFilePartLoader();
        if ( mParserImpl )
        {
            delete mParserImpl;
            mParserImpl = 0;
        }
	}